

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCommsInterface.cpp
# Opt level: O3

void __thiscall
helics::NetworkCommsInterface::setFlag(NetworkCommsInterface *this,string_view flag,bool val)

{
  bool bVar1;
  long *plVar2;
  
  plVar2 = (long *)flag._M_str;
  if (flag._M_len == 0xd) {
    if (*(long *)((long)plVar2 + 5) != 0x7463656e6e6f635f || *plVar2 != 0x6f635f6b63616f6e)
    goto LAB_00287798;
    bVar1 = CommsInterface::propertyLock(&this->super_CommsInterface);
    if (!bVar1) {
      return;
    }
    this->noAckConnection = val;
  }
  else {
    if ((flag._M_len != 7) ||
       (*(int *)((long)plVar2 + 3) != 0x74726f70 || (int)*plVar2 != 0x705f736f)) {
LAB_00287798:
      CommsInterface::setFlag(&this->super_CommsInterface,flag,val);
      return;
    }
    bVar1 = CommsInterface::propertyLock(&this->super_CommsInterface);
    if (!bVar1) {
      return;
    }
    this->useOsPortAllocation = val;
  }
  CommsInterface::propertyUnLock(&this->super_CommsInterface);
  return;
}

Assistant:

void NetworkCommsInterface::setFlag(std::string_view flag, bool val)
{
    if (flag == "os_port") {
        if (propertyLock()) {
            useOsPortAllocation = val;
            propertyUnLock();
        }
    } else if (flag == "noack_connect") {
        if (propertyLock()) {
            noAckConnection = val;
            propertyUnLock();
        }
    } else {
        CommsInterface::setFlag(flag, val);
    }
}